

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void shift_reg(DisasContext_conflict2 *s,uint16_t insn,int opsize)

{
  TCGContext_conflict2 *tcg_ctx_00;
  int iVar1;
  int iVar2;
  TCGv_i32 arg;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 c2;
  TCGv_i64 c2_00;
  TCGv_i64 tt;
  TCGv_i32 zero;
  TCGv_i64 s64;
  TCGv_i64 t64;
  TCGv_i32 s32;
  TCGv_i32 reg;
  int bits;
  int left;
  int logical;
  TCGContext_conflict2 *tcg_ctx;
  int opsize_local;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = opsize_bytes(opsize);
  arg = gen_extend(s,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],opsize,
                   (uint)(((insn & 8) != 0 ^ 0xffU) & 1));
  ret = tcg_temp_new_i64(tcg_ctx_00);
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  ret_01 = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_andi_i32_m68k
            (tcg_ctx_00,ret_01,tcg_ctx_00->cpu_dregs[(int)((int)(uint)insn >> 9 & 7)],0x3f);
  tcg_gen_extu_i32_i64_m68k(tcg_ctx_00,ret_00,ret_01);
  tcg_gen_extu_i32_i64_m68k(tcg_ctx_00,ret,arg);
  tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_V,0);
  if ((insn & 0x100) == 0) {
    tcg_gen_shli_i64_m68k(tcg_ctx_00,ret,ret,0x20);
    if ((insn & 8) == 0) {
      tcg_gen_sar_i64_m68k(tcg_ctx_00,ret,ret,ret_00);
    }
    else {
      tcg_gen_shr_i64_m68k(tcg_ctx_00,ret,ret,ret_00);
    }
    tcg_gen_extr_i64_i32_m68k(tcg_ctx_00,QREG_CC_C,QREG_CC_N,ret);
    tcg_gen_shri_i32_m68k(tcg_ctx_00,QREG_CC_C,QREG_CC_C,0x1f);
    tcg_gen_movcond_i32_m68k(tcg_ctx_00,TCG_COND_NE,QREG_CC_X,ret_01,QREG_CC_V,QREG_CC_C,QREG_CC_X);
  }
  else {
    tcg_gen_shl_i64_m68k(tcg_ctx_00,ret,ret,ret_00);
    if (opsize == 2) {
      tcg_gen_extr_i64_i32_m68k(tcg_ctx_00,QREG_CC_N,QREG_CC_C,ret);
    }
    else {
      c2 = tcg_const_i32_m68k(tcg_ctx_00,0);
      tcg_gen_extrl_i64_i32_m68k(tcg_ctx_00,QREG_CC_N,ret);
      tcg_gen_shri_i32_m68k(tcg_ctx_00,QREG_CC_C,QREG_CC_N,iVar1 << 3);
      tcg_gen_movcond_i32_m68k(tcg_ctx_00,TCG_COND_EQ,QREG_CC_C,ret_01,c2,c2,QREG_CC_C);
      tcg_temp_free_i32(tcg_ctx_00,c2);
    }
    tcg_gen_andi_i32_m68k(tcg_ctx_00,QREG_CC_C,QREG_CC_C,1);
    tcg_gen_movcond_i32_m68k(tcg_ctx_00,TCG_COND_NE,QREG_CC_X,ret_01,QREG_CC_V,QREG_CC_C,QREG_CC_X);
    if (((insn & 8) == 0) && (iVar2 = m68k_feature(s->env,0), iVar2 != 0)) {
      c2_00 = tcg_const_i64_m68k(tcg_ctx_00,0x20);
      tcg_gen_movcond_i64_m68k(tcg_ctx_00,TCG_COND_GT,ret_00,ret_00,c2_00,c2_00,ret_00);
      tcg_temp_free_i64(tcg_ctx_00,c2_00);
      tcg_gen_ext_i32_i64_m68k(tcg_ctx_00,ret,arg);
      tcg_gen_shl_i64_m68k(tcg_ctx_00,ret_00,ret,ret_00);
      tcg_gen_xor_i64_m68k(tcg_ctx_00,ret,ret,ret_00);
      tcg_gen_andi_i64_m68k(tcg_ctx_00,ret,ret,-1L << ((char)(iVar1 << 3) - 1U & 0x3f));
      tcg_gen_setcondi_i64_m68k(tcg_ctx_00,TCG_COND_NE,ret,ret,0);
      tcg_gen_extrl_i64_i32_m68k(tcg_ctx_00,QREG_CC_V,ret);
      tcg_gen_neg_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_V);
    }
  }
  gen_ext(tcg_ctx_00,QREG_CC_N,QREG_CC_N,opsize,1);
  tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_Z,QREG_CC_N);
  tcg_temp_free_i32(tcg_ctx_00,ret_01);
  tcg_temp_free_i64(tcg_ctx_00,ret_00);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  gen_partset_reg(tcg_ctx_00,opsize,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],QREG_CC_N);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static inline void shift_reg(DisasContext *s, uint16_t insn, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int logical = insn & 8;
    int left = insn & 0x100;
    int bits = opsize_bytes(opsize) * 8;
    TCGv reg = gen_extend(s, DREG(insn, 0), opsize, !logical);
    TCGv s32;
    TCGv_i64 t64, s64;

    t64 = tcg_temp_new_i64(tcg_ctx);
    s64 = tcg_temp_new_i64(tcg_ctx);
    s32 = tcg_temp_new(tcg_ctx);

    /*
     * Note that m68k truncates the shift count modulo 64, not 32.
     * In addition, a 64-bit shift makes it easy to find "the last
     * bit shifted out", for the carry flag.
     */
    tcg_gen_andi_i32(tcg_ctx, s32, DREG(insn, 9), 63);
    tcg_gen_extu_i32_i64(tcg_ctx, s64, s32);
    tcg_gen_extu_i32_i64(tcg_ctx, t64, reg);

    /* Optimistically set V=0.  Also used as a zero source below.  */
    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
    if (left) {
        tcg_gen_shl_i64(tcg_ctx, t64, t64, s64);

        if (opsize == OS_LONG) {
            tcg_gen_extr_i64_i32(tcg_ctx, QREG_CC_N, QREG_CC_C, t64);
            /* Note that C=0 if shift count is 0, and we get that for free.  */
        } else {
            TCGv zero = tcg_const_i32(tcg_ctx, 0);
            tcg_gen_extrl_i64_i32(tcg_ctx, QREG_CC_N, t64);
            tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, QREG_CC_N, bits);
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, QREG_CC_C,
                                s32, zero, zero, QREG_CC_C);
            tcg_temp_free(tcg_ctx, zero);
        }
        tcg_gen_andi_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 1);

        /* X = C, but only if the shift count was non-zero.  */
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_X, s32, QREG_CC_V,
                            QREG_CC_C, QREG_CC_X);

        /*
         * M68000 sets V if the most significant bit is changed at
         * any time during the shift operation.  Do this via creating
         * an extension of the sign bit, comparing, and discarding
         * the bits below the sign bit.  I.e.
         *     int64_t s = (intN_t)reg;
         *     int64_t t = (int64_t)(intN_t)reg << count;
         *     V = ((s ^ t) & (-1 << (bits - 1))) != 0
         */
        if (!logical && m68k_feature(s->env, M68K_FEATURE_M68000)) {
            TCGv_i64 tt = tcg_const_i64(tcg_ctx, 32);
            /* if shift is greater than 32, use 32 */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_GT, s64, s64, tt, tt, s64);
            tcg_temp_free_i64(tcg_ctx, tt);
            /* Sign extend the input to 64 bits; re-do the shift.  */
            tcg_gen_ext_i32_i64(tcg_ctx, t64, reg);
            tcg_gen_shl_i64(tcg_ctx, s64, t64, s64);
            /* Clear all bits that are unchanged.  */
            tcg_gen_xor_i64(tcg_ctx, t64, t64, s64);
            /* Ignore the bits below the sign bit.  */
#ifdef _MSC_VER
            tcg_gen_andi_i64(tcg_ctx, t64, t64, 0xffffffffffffffffULL << (bits - 1));
#else
            tcg_gen_andi_i64(tcg_ctx, t64, t64, -1ULL << (bits - 1));
#endif
            /* If any bits remain set, we have overflow.  */
            tcg_gen_setcondi_i64(tcg_ctx, TCG_COND_NE, t64, t64, 0);
            tcg_gen_extrl_i64_i32(tcg_ctx, QREG_CC_V, t64);
            tcg_gen_neg_i32(tcg_ctx, QREG_CC_V, QREG_CC_V);
        }
    } else {
        tcg_gen_shli_i64(tcg_ctx, t64, t64, 32);
        if (logical) {
            tcg_gen_shr_i64(tcg_ctx, t64, t64, s64);
        } else {
            tcg_gen_sar_i64(tcg_ctx, t64, t64, s64);
        }
        tcg_gen_extr_i64_i32(tcg_ctx, QREG_CC_C, QREG_CC_N, t64);

        /* Note that C=0 if shift count is 0, and we get that for free.  */
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 31);

        /* X = C, but only if the shift count was non-zero.  */
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_X, s32, QREG_CC_V,
                            QREG_CC_C, QREG_CC_X);
    }
    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);

    tcg_temp_free(tcg_ctx, s32);
    tcg_temp_free_i64(tcg_ctx, s64);
    tcg_temp_free_i64(tcg_ctx, t64);

    /* Write back the result.  */
    gen_partset_reg(tcg_ctx, opsize, DREG(insn, 0), QREG_CC_N);
    set_cc_op(s, CC_OP_FLAGS);
}